

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_bool nk_do_toggle(nk_flags *state,nk_command_buffer *out,nk_rect r,nk_bool *active,char *str,
                    int len,nk_toggle_type type,nk_style_toggle *style,nk_input *in,
                    nk_user_font *font)

{
  int iVar1;
  undefined1 auVar2 [16];
  float fVar3;
  undefined4 in_EAX;
  uint uVar4;
  nk_bool nVar5;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var6;
  nk_image *img;
  uint uVar7;
  nk_flags nVar8;
  nk_style_item *pnVar9;
  nk_style_toggle *pnVar10;
  char *string;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float fVar11;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  nk_rect r_00;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect r_01;
  nk_rect nVar18;
  nk_rect r_03;
  nk_rect r_04;
  nk_rect rect_01;
  nk_rect r_05;
  nk_rect r_06;
  nk_rect rect_02;
  nk_rect b;
  undefined8 local_118;
  float local_108;
  float fStack_104;
  nk_text local_e0;
  nk_toggle_type local_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  undefined4 uStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  char *local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  nk_rect r_02;
  
  nVar18.x = r.x;
  fStack_c4 = r.y;
  auVar17._0_4_ = -(uint)(out == (nk_command_buffer *)0x0);
  auVar17._4_4_ = -(uint)(style == (nk_style_toggle *)0x0);
  auVar17._8_4_ = -(uint)(font == (nk_user_font *)0x0);
  auVar17._12_4_ = -(uint)(active == (nk_bool *)0x0);
  uVar4 = movmskps(in_EAX,auVar17);
  p_Var6 = (_func_void_nk_command_buffer_ptr_nk_handle *)(ulong)uVar4;
  if (uVar4 != 0) goto LAB_0011db64;
  local_98 = font->height;
  fVar13 = style->border;
  local_68 = fVar13 + fVar13;
  fVar11 = (style->touch_padding).x;
  fVar15 = (style->touch_padding).y;
  local_88 = nVar18.x - fVar11;
  fStack_84 = fStack_c4 - fVar15;
  fStack_80 = in_XMM0_Dc - 0.0;
  fStack_7c = in_XMM0_Dd - 0.0;
  local_108 = (style->padding).x;
  fStack_104 = (style->padding).y;
  local_b8 = local_108 + local_108;
  fStack_b4 = fStack_104 + fStack_104;
  fStack_b0 = 0.0;
  fStack_ac = 0.0;
  auVar16._0_4_ = local_b8 + local_98;
  auVar16._4_4_ = fStack_b4 + local_98;
  auVar16._8_4_ = local_98 + 0.0;
  auVar16._12_4_ = local_98 + 0.0;
  auVar2._8_4_ = in_XMM1_Dc;
  auVar2._0_8_ = r._8_8_;
  auVar2._12_4_ = in_XMM1_Dd;
  auVar17 = maxps(auVar16,auVar2);
  local_78 = fVar11 + fVar11 + auVar17._0_4_;
  fStack_54 = auVar17._4_4_;
  fStack_74 = fVar15 + fVar15 + fStack_54;
  fStack_70 = auVar17._8_4_ + 0.0;
  fStack_6c = auVar17._12_4_ + 0.0;
  fVar11 = (fStack_54 * 0.5 + fStack_c4) - local_98 * 0.5;
  fVar15 = auVar17._0_4_ + nVar18.x;
  local_48 = ZEXT416((uint)local_98);
  b.x = nVar18.x + local_98 + style->spacing;
  local_c8 = b.x;
  if (b.x <= fVar15) {
    local_c8 = fVar15;
  }
  uVar4 = *active;
  *state = *state & 2 | 4;
  r_00.y = fStack_84;
  r_00.x = local_88;
  r_00.h = fStack_74;
  r_00.w = local_78;
  local_cc = type;
  local_a0 = str;
  fStack_94 = local_98;
  fStack_90 = local_98;
  fStack_8c = local_98;
  fStack_64 = local_68;
  fStack_60 = local_68;
  fStack_5c = local_68;
  local_58 = fVar11;
  fStack_50 = fStack_54;
  fStack_4c = fStack_54;
  nVar5 = nk_button_behavior(state,r_00,in,NK_BUTTON_DEFAULT);
  if (nVar5 == 0) {
    uVar7 = *state;
    if (((uVar7 & 0x10) == 0) ||
       (rect.y = fStack_84, rect.x = local_88, rect.h = fStack_74, rect.w = local_78,
       nVar5 = nk_input_is_mouse_prev_hovering_rect(in,rect), nVar5 != 0)) goto LAB_0011d836;
    nVar8 = uVar7 | 8;
LAB_0011d85b:
    *state = nVar8;
  }
  else {
    *state = 0x22;
    uVar4 = (uint)(uVar4 == 0);
    uVar7 = 0x22;
LAB_0011d836:
    rect_00.y = fStack_84;
    rect_00.x = local_88;
    rect_00.h = fStack_74;
    rect_00.w = local_78;
    nVar5 = nk_input_is_mouse_prev_hovering_rect(in,rect_00);
    if (nVar5 != 0) {
      nVar8 = uVar7 | 0x40;
      goto LAB_0011d85b;
    }
  }
  local_c8 = local_c8 - b.x;
  *active = uVar4;
  fVar15 = local_b8 + local_68;
  fVar14 = fStack_b4 + fStack_64;
  if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    local_b8 = local_b8 + local_68;
    fStack_b4 = fStack_b4 + fStack_64;
    fStack_b0 = fStack_b0 + fStack_60;
    fStack_ac = fStack_ac + fStack_5c;
    (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
    fVar15 = local_b8;
    fVar14 = fStack_b4;
  }
  fVar3 = local_58;
  fStack_c0 = fStack_c4;
  fVar12 = local_108 + nVar18.x + fVar13;
  fVar13 = fStack_104 + fVar11 + fVar13;
  rect_01.h = fStack_94;
  rect_01.w = local_98;
  fVar15 = local_98 - fVar15;
  fVar14 = fStack_94 - fVar14;
  fStack_c4 = (float)local_48._0_4_;
  uStack_bc = local_48._4_4_;
  uVar4 = *state;
  iVar1 = *active;
  if (local_cc == NK_TOGGLE_CHECK) {
    if ((uVar4 & 0x10) == 0) {
      if ((uVar4 & 0x20) != 0) {
        local_e0.text = style->text_active;
        goto LAB_0011da6a;
      }
      pnVar9 = &style->cursor_normal;
      local_e0.text = style->text_normal;
      pnVar10 = style;
    }
    else {
      local_e0.text = style->text_hover;
LAB_0011da6a:
      pnVar10 = (nk_style_toggle *)&style->hover;
      pnVar9 = &style->cursor_hover;
    }
    if ((pnVar10->normal).type == NK_STYLE_ITEM_COLOR) {
      rect_01.y = fVar11;
      rect_01.x = nVar18.x;
      nk_fill_rect(out,rect_01,0.0,style->border_color);
      r_05.y = fVar11;
      r_05.x = nVar18.x;
      r_05.h = fStack_94;
      r_05.w = local_98;
      nVar18 = nk_shrink_rect(r_05,style->border);
      nk_fill_rect(out,nVar18,0.0,(pnVar10->normal).data.color);
    }
    else {
      r_04.y = fVar11;
      r_04.x = nVar18.x;
      r_04.w = local_98;
      r_04.h = fStack_94;
      nk_draw_image(out,r_04,&(pnVar10->normal).data.image,(nk_color)0xffffffff);
    }
    string = local_a0;
    if (iVar1 != 0) {
      img = (nk_image *)&pnVar9->data;
      if (pnVar9->type == NK_STYLE_ITEM_IMAGE) goto LAB_0011daf2;
      rect_02.y = fVar13;
      rect_02.x = fVar12;
      rect_02.w = fVar15;
      rect_02.h = fVar14;
      nk_fill_rect(out,rect_02,0.0,*(nk_color *)img);
    }
  }
  else {
    if ((uVar4 & 0x10) == 0) {
      if ((uVar4 & 0x20) != 0) {
        local_e0.text = style->text_active;
        goto LAB_0011d9b3;
      }
      pnVar9 = &style->cursor_normal;
      local_e0.text = style->text_normal;
      pnVar10 = style;
    }
    else {
      local_e0.text = style->text_hover;
LAB_0011d9b3:
      pnVar10 = (nk_style_toggle *)&style->hover;
      pnVar9 = &style->cursor_hover;
    }
    if ((pnVar10->normal).type == NK_STYLE_ITEM_COLOR) {
      r_01.y = fVar11;
      r_01.x = nVar18.x;
      r_01.w = local_98;
      r_01.h = fStack_94;
      nk_fill_circle(out,r_01,style->border_color);
      r_02.y = fVar11;
      r_02.x = nVar18.x;
      r_02.h = fStack_94;
      r_02.w = local_98;
      nVar18 = nk_shrink_rect(r_02,style->border);
      nk_fill_circle(out,nVar18,(pnVar10->normal).data.color);
    }
    else {
      nVar18.y = fVar11;
      nVar18.w = local_98;
      nVar18.h = fStack_94;
      nk_draw_image(out,nVar18,&(pnVar10->normal).data.image,(nk_color)0xffffffff);
    }
    string = local_a0;
    r_03.y = fVar13;
    r_03.x = fVar12;
    if (iVar1 != 0) {
      img = (nk_image *)&pnVar9->data;
      if (pnVar9->type == NK_STYLE_ITEM_IMAGE) {
LAB_0011daf2:
        string = local_a0;
        r_06.y = fVar13;
        r_06.x = fVar12;
        r_06.w = fVar15;
        r_06.h = fVar14;
        nk_draw_image(out,r_06,img,(nk_color)0xffffffff);
      }
      else {
        r_03.w = fVar15;
        r_03.h = fVar14;
        nk_fill_circle(out,r_03,*(nk_color *)img);
      }
    }
  }
  local_e0.padding.x = 0.0;
  local_e0.padding.y = 0.0;
  local_e0.background = style->text_background;
  b.h = fStack_c4;
  b.w = local_c8;
  b.y = fVar3;
  nk_widget_text(out,b,string,len,&local_e0,0x11,font);
  p_Var6 = style->draw_end;
  if (p_Var6 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    p_Var6 = (_func_void_nk_command_buffer_ptr_nk_handle *)
             (*p_Var6)(out,(nk_handle)(style->userdata).ptr);
  }
LAB_0011db64:
  return (nk_bool)p_Var6;
}

Assistant:

NK_LIB nk_bool
nk_do_toggle(nk_flags *state,
struct nk_command_buffer *out, struct nk_rect r,
nk_bool *active, const char *str, int len, enum nk_toggle_type type,
const struct nk_style_toggle *style, const struct nk_input *in,
const struct nk_user_font *font)
{
int was_active;
struct nk_rect bounds;
struct nk_rect select;
struct nk_rect cursor;
struct nk_rect label;

NK_ASSERT(style);
NK_ASSERT(out);
NK_ASSERT(font);
if (!out || !style || !font || !active)
return 0;

r.w = NK_MAX(r.w, font->height + 2 * style->padding.x);
r.h = NK_MAX(r.h, font->height + 2 * style->padding.y);

/* add additional touch padding for touch screen devices */
bounds.x = r.x - style->touch_padding.x;
bounds.y = r.y - style->touch_padding.y;
bounds.w = r.w + 2 * style->touch_padding.x;
bounds.h = r.h + 2 * style->touch_padding.y;

/* calculate the selector space */
select.w = font->height;
select.h = select.w;
select.y = r.y + r.h/2.0f - select.h/2.0f;
select.x = r.x;

/* calculate the bounds of the cursor inside the selector */
cursor.x = select.x + style->padding.x + style->border;
cursor.y = select.y + style->padding.y + style->border;
cursor.w = select.w - (2 * style->padding.x + 2 * style->border);
cursor.h = select.h - (2 * style->padding.y + 2 * style->border);

/* label behind the selector */
label.x = select.x + select.w + style->spacing;
label.y = select.y;
label.w = NK_MAX(r.x + r.w, label.x) - label.x;
label.h = select.w;

/* update selector */
was_active = *active;
*active = nk_toggle_behavior(in, bounds, state, *active);

/* draw selector */
if (style->draw_begin)
style->draw_begin(out, style->userdata);
if (type == NK_TOGGLE_CHECK) {
nk_draw_checkbox(out, *state, style, *active, &label, &select, &cursor, str, len, font);
} else {
nk_draw_option(out, *state, style, *active, &label, &select, &cursor, str, len, font);
}
if (style->draw_end)
style->draw_end(out, style->userdata);
return (was_active != *active);
}